

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

WebPEncodingError
StoreImageToBitMask(VP8LBitWriter *bw,int width,int histo_bits,VP8LBackwardRefs *refs,
                   uint16_t *histogram_symbols,HuffmanTreeCode *huffman_codes)

{
  byte bVar1;
  ushort uVar2;
  uint32_t uVar3;
  byte bVar4;
  PixOrCopy *pPVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint16_t **ppuVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  VP8LRefsCursor c;
  HuffmanTreeCode *local_90;
  uint local_74;
  uint local_70;
  VP8LRefsCursor local_48;
  
  bVar4 = (byte)histo_bits;
  uVar11 = (width + (1 << (bVar4 & 0x1f))) - 1U >> (bVar4 & 0x1f);
  uVar12 = -1 << (bVar4 & 0x1f);
  if (histo_bits == 0) {
    uVar11 = 1;
    uVar12 = 0;
  }
  uVar2 = *histogram_symbols;
  VP8LRefsCursorInit(&local_48,refs);
  if (local_48.cur_pos != (PixOrCopy *)0x0) {
    local_90 = huffman_codes + (ulong)uVar2 * 5;
    uVar9 = 0;
    uVar15 = 0;
    local_70 = 0;
    local_74 = 0;
    do {
      pPVar5 = local_48.cur_pos;
      if ((local_70 != (uVar9 & uVar12)) || (local_74 != (uVar15 & uVar12))) {
        local_90 = huffman_codes +
                   (ulong)histogram_symbols
                          [(int)(((int)uVar9 >> (bVar4 & 0x1f)) +
                                ((int)uVar15 >> (bVar4 & 0x1f)) * uVar11)] * 5;
        local_74 = uVar15 & uVar12;
        local_70 = uVar9 & uVar12;
      }
      if ((local_48.cur_pos)->mode == '\x01') {
        uVar6 = (uint)local_90->code_lengths
                      [(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118];
        if (local_90->code_lengths[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118] != 0) {
          uVar8 = (ulong)local_90->codes[(long)(int)(local_48.cur_pos)->argb_or_distance + 0x118];
          if (0x1f < bw->used_) {
            VP8LPutBitsFlushBits(bw);
          }
LAB_001427fd:
          bw->bits_ = bw->bits_ | uVar8 << ((byte)bw->used_ & 0x3f);
          bw->used_ = uVar6 + bw->used_;
        }
      }
      else if ((local_48.cur_pos)->mode == '\0') {
        ppuVar14 = &local_90->codes;
        lVar10 = 0;
        do {
          uVar6 = pPVar5->argb_or_distance >> (("\x01\x02"[lVar10] & 3) << 3) & 0xff;
          bVar1 = *(byte *)((long)ppuVar14[-1] + (ulong)uVar6);
          if (bVar1 != 0) {
            uVar2 = (*ppuVar14)[uVar6];
            if (0x1f < bw->used_) {
              VP8LPutBitsFlushBits(bw);
            }
            bw->bits_ = bw->bits_ | (ulong)uVar2 << ((byte)bw->used_ & 0x3f);
            bw->used_ = (uint)bVar1 + bw->used_;
          }
          lVar10 = lVar10 + 1;
          ppuVar14 = ppuVar14 + 3;
        } while (lVar10 != 4);
      }
      else {
        uVar8 = (ulong)(local_48.cur_pos)->len;
        if (uVar8 < 0x200) {
          uVar6 = (uint)kPrefixEncodeCode[uVar8].code_;
          uVar16 = (uint)kPrefixEncodeCode[uVar8].extra_bits_;
          uVar13 = (uint)""[uVar8];
        }
        else {
          uVar7 = (local_48.cur_pos)->len - 1;
          uVar6 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar16 = 0x1e - (uVar6 ^ 0x1f);
          uVar13 = ~(-1 << ((byte)uVar16 & 0x1f)) & uVar7;
          uVar6 = (uint)((uVar7 >> (uVar16 & 0x1f) & 1) != 0) + (uVar6 ^ 0x1f) * 2 ^ 0x3e;
        }
        uVar3 = (local_48.cur_pos)->argb_or_distance;
        bVar1 = local_90->code_lengths[uVar6 + 0x100];
        iVar17 = uVar16 + bVar1;
        if (iVar17 != 0 && SCARRY4(uVar16,(uint)bVar1) == iVar17 < 0) {
          uVar2 = local_90->codes[uVar6 + 0x100];
          if (0x1f < bw->used_) {
            VP8LPutBitsFlushBits(bw);
          }
          bw->bits_ = bw->bits_ |
                      (ulong)(uVar13 << (bVar1 & 0x1f) | (uint)uVar2) << ((byte)bw->used_ & 0x3f);
          bw->used_ = iVar17 + bw->used_;
        }
        if ((int)uVar3 < 0x200) {
          uVar7 = (uint)kPrefixEncodeCode[(int)uVar3].code_;
          uVar6 = (uint)kPrefixEncodeCode[(int)uVar3].extra_bits_;
          uVar16 = (uint)""[(int)uVar3];
        }
        else {
          uVar13 = uVar3 - 1;
          uVar7 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar6 = 0x1e - (uVar7 ^ 0x1f);
          uVar16 = ~(-1 << ((byte)uVar6 & 0x1f)) & uVar13;
          uVar7 = (uint)((uVar13 >> (uVar6 & 0x1f) & 1) != 0) + (uVar7 ^ 0x1f) * 2 ^ 0x3e;
        }
        bVar1 = local_90[4].code_lengths[(int)uVar7];
        if (bVar1 != 0) {
          uVar2 = local_90[4].codes[(int)uVar7];
          if (0x1f < bw->used_) {
            VP8LPutBitsFlushBits(bw);
          }
          bw->bits_ = bw->bits_ | (ulong)uVar2 << ((byte)bw->used_ & 0x3f);
          bw->used_ = (uint)bVar1 + bw->used_;
        }
        if (0 < (int)uVar6) {
          if (0x1f < bw->used_) {
            VP8LPutBitsFlushBits(bw);
          }
          uVar8 = (ulong)uVar16;
          goto LAB_001427fd;
        }
      }
      for (uVar9 = uVar9 + pPVar5->len; width <= (int)uVar9; uVar9 = uVar9 - width) {
        uVar15 = uVar15 + 1;
      }
      local_48.cur_pos = local_48.cur_pos + 1;
      if (local_48.cur_pos == local_48.last_pos_) {
        VP8LRefsCursorNextBlock(&local_48);
      }
    } while (local_48.cur_pos != (PixOrCopy *)0x0);
  }
  return (WebPEncodingError)(bw->error_ != 0);
}

Assistant:

static WebPEncodingError StoreImageToBitMask(
    VP8LBitWriter* const bw, int width, int histo_bits,
    const VP8LBackwardRefs* const refs,
    const uint16_t* histogram_symbols,
    const HuffmanTreeCode* const huffman_codes) {
  const int histo_xsize = histo_bits ? VP8LSubSampleSize(width, histo_bits) : 1;
  const int tile_mask = (histo_bits == 0) ? 0 : -(1 << histo_bits);
  // x and y trace the position in the image.
  int x = 0;
  int y = 0;
  int tile_x = x & tile_mask;
  int tile_y = y & tile_mask;
  int histogram_ix = histogram_symbols[0];
  const HuffmanTreeCode* codes = huffman_codes + 5 * histogram_ix;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    if ((tile_x != (x & tile_mask)) || (tile_y != (y & tile_mask))) {
      tile_x = x & tile_mask;
      tile_y = y & tile_mask;
      histogram_ix = histogram_symbols[(y >> histo_bits) * histo_xsize +
                                       (x >> histo_bits)];
      codes = huffman_codes + 5 * histogram_ix;
    }
    if (PixOrCopyIsLiteral(v)) {
      static const uint8_t order[] = { 1, 2, 0, 3 };
      int k;
      for (k = 0; k < 4; ++k) {
        const int code = PixOrCopyLiteral(v, order[k]);
        WriteHuffmanCode(bw, codes + k, code);
      }
    } else if (PixOrCopyIsCacheIdx(v)) {
      const int code = PixOrCopyCacheIdx(v);
      const int literal_ix = 256 + NUM_LENGTH_CODES + code;
      WriteHuffmanCode(bw, codes, literal_ix);
    } else {
      int bits, n_bits;
      int code;

      const int distance = PixOrCopyDistance(v);
      VP8LPrefixEncode(v->len, &code, &n_bits, &bits);
      WriteHuffmanCodeWithExtraBits(bw, codes, 256 + code, bits, n_bits);

      // Don't write the distance with the extra bits code since
      // the distance can be up to 18 bits of extra bits, and the prefix
      // 15 bits, totaling to 33, and our PutBits only supports up to 32 bits.
      VP8LPrefixEncode(distance, &code, &n_bits, &bits);
      WriteHuffmanCode(bw, codes + 4, code);
      VP8LPutBits(bw, bits, n_bits);
    }
    x += PixOrCopyLength(v);
    while (x >= width) {
      x -= width;
      ++y;
    }
    VP8LRefsCursorNext(&c);
  }
  return bw->error_ ? VP8_ENC_ERROR_OUT_OF_MEMORY : VP8_ENC_OK;
}